

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<float,_false,_false>::DirectSetItemAtRange
          (TypedArray<float,_false,_false> *this,TypedArray<float,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_float_Var_ScriptContext_ptr *convFunc)

{
  Type puVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  float fVar10;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_7c;
  uint local_78;
  uint local_68;
  uint32 i;
  float undefinedValue;
  size_t byteSize;
  uint32 srcLength;
  uint32 dstLength;
  uint32 start;
  float *srcBuffer;
  float *dstBuffer;
  _func_float_Var_ScriptContext_ptr *convFunc_local;
  uint32 length_local;
  int32 iDstStart_local;
  int32 iSrcStart_local;
  TypedArray<float,_false,_false> *fromArray_local;
  TypedArray<float,_false,_false> *this_local;
  
  puVar1 = (this->super_TypedArrayBase).buffer;
  puVar2 = (fromArray->super_TypedArrayBase).buffer;
  if ((puVar2 == (Type)0x0) || (puVar1 == (Type)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (0x1fffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if ((!bVar4) &&
     (bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&fromArray->super_TypedArrayBase), !bVar4)) {
    srcLength = iDstStart;
    convFunc_local._4_4_ = length;
    if (iDstStart < 0) {
      if ((long)((ulong)length + (long)iDstStart) < 0) {
        return 1;
      }
      convFunc_local._4_4_ = iDstStart + length;
      srcLength = 0;
    }
    uVar5 = UInt32Math::Add(srcLength,convFunc_local._4_4_);
    uVar6 = ArrayObject::GetLength((ArrayObject *)this);
    if (uVar5 < uVar6) {
      local_78 = convFunc_local._4_4_;
    }
    else {
      uVar5 = ArrayObject::GetLength((ArrayObject *)this);
      if (srcLength < uVar5) {
        uVar5 = ArrayObject::GetLength((ArrayObject *)this);
        local_7c = uVar5 - srcLength;
      }
      else {
        local_7c = 0;
      }
      local_78 = local_7c;
    }
    uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
    if (srcLength + convFunc_local._4_4_ < uVar5) {
      local_84 = convFunc_local._4_4_;
    }
    else {
      uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
      if (srcLength < uVar5) {
        uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
        local_88 = uVar5 - srcLength;
      }
      else {
        local_88 = 0;
      }
      local_84 = local_88;
    }
    if (convFunc_local._4_4_ < local_84) {
      if (convFunc_local._4_4_ < local_78) {
        local_8c = convFunc_local._4_4_;
      }
      else {
        local_8c = local_78;
      }
      local_90 = local_8c;
    }
    else {
      if (local_84 < local_78) {
        local_94 = local_84;
      }
      else {
        local_94 = local_78;
      }
      local_90 = local_94;
    }
    if ((ulong)local_90 << 2 < (ulong)local_90) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x175,"(byteSize >= length)","byteSize >= length");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    js_memcpy_s(puVar1 + (ulong)srcLength * 4,(ulong)local_78 << 2,puVar2 + (ulong)srcLength * 4,
                (ulong)local_90 << 2);
    if (local_90 < local_78) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar8 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      fVar10 = (*convFunc)(pRVar8,pSVar9);
      for (local_68 = local_90; local_68 < local_78; local_68 = local_68 + 1) {
        *(float *)(puVar1 + (ulong)local_68 * 4) = fVar10;
      }
    }
    return 1;
  }
  pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }